

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O1

void aes192_ni_cbc_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  
  if (0 < blklen) {
    pauVar2 = (undefined1 (*) [16])((long)blklen + (long)vblk);
    do {
      auVar1 = *vblk;
      auVar3 = aesdec(*(undefined1 (*) [16])(ciph + -0x21) ^ auVar1,
                      *(undefined1 (*) [16])(ciph + -0x1f));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x1d));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x1b));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x19));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x17));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x15));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x13));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0x11));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0xf));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0xd));
      auVar3 = aesdec(auVar3,*(undefined1 (*) [16])(ciph + -0xb));
      auVar3 = aesdeclast(auVar3,*(undefined1 (*) [16])(ciph + -9));
      *(undefined1 (*) [16])vblk = auVar3 ^ *(undefined1 (*) [16])(ciph + -3);
      *(undefined1 (*) [16])(ciph + -3) = auVar1;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < pauVar2);
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn decrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i ciphertext = _mm_loadu_si128((const __m128i *)blk);
        __m128i decrypted = decrypt(ciphertext, ctx->keysched_d);
        __m128i plaintext = _mm_xor_si128(decrypted, ctx->iv);
        _mm_storeu_si128((__m128i *)blk, plaintext);
        ctx->iv = ciphertext;
    }
}